

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

int strbin(char *str)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  long lVar10;
  
  iVar7 = (int)str;
  pbVar6 = (byte *)str;
  do {
    while( true ) {
      pbVar4 = pbVar6 + 1;
      bVar8 = *pbVar6;
      if (bVar8 == 0x5c) break;
      if (bVar8 == 0) {
        *str = 0;
        return (int)str - iVar7;
      }
      *str = bVar8;
      str = (char *)((byte *)str + 1);
      pbVar6 = pbVar4;
    }
    bVar8 = *pbVar4;
    pbVar5 = pbVar4;
    if (bVar8 < 0x58) {
      if (bVar8 - 0x30 < 8) {
        pbVar5 = pbVar6 + 4;
        lVar10 = 1;
        bVar8 = 0;
        do {
          bVar8 = bVar8 * '\b';
          if ((pbVar6[lVar10] & 0xf8) != 0x30) {
            pbVar5 = pbVar6 + lVar10;
            break;
          }
          bVar8 = (bVar8 + pbVar6[lVar10]) - 0x30;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 != 4);
        goto switchD_004ad57a_caseD_64;
      }
      if (bVar8 != 10) goto switchD_004ad57a_caseD_64;
    }
    else {
      switch(bVar8) {
      case 0x6e:
        bVar8 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
        break;
      case 0x72:
        bVar8 = 0xd;
        break;
      case 0x74:
        bVar8 = 9;
        break;
      case 0x76:
        bVar8 = 0xb;
        break;
      case 0x78:
switchD_004ad589_caseD_78:
        bVar8 = 0;
        bVar2 = true;
        do {
          bVar9 = bVar2;
          bVar1 = pbVar4[1];
          cVar3 = -0x30;
          if (((9 < (byte)(bVar1 - 0x30)) && (cVar3 = -0x57, 5 < (byte)(bVar1 + 0x9f))) &&
             (cVar3 = -0x37, pbVar5 = pbVar4, 5 < (byte)(bVar1 + 0xbf))) break;
          pbVar4 = pbVar4 + 1;
          bVar8 = bVar8 * '\x10' + cVar3 + bVar1;
          pbVar5 = pbVar6 + 3;
          bVar2 = false;
        } while (bVar9);
        break;
      default:
        switch(bVar8) {
        case 0x61:
          bVar8 = 7;
          break;
        case 0x62:
          bVar8 = 8;
          break;
        case 99:
          bVar8 = 0x1c;
          break;
        case 100:
        case 0x65:
          break;
        case 0x66:
          bVar8 = 0xc;
          break;
        default:
          if (bVar8 == 0x58) goto switchD_004ad589_caseD_78;
        }
      }
switchD_004ad57a_caseD_64:
      *str = bVar8;
      str = (char *)((byte *)str + 1);
      pbVar4 = pbVar5;
    }
    pbVar6 = pbVar4 + 1;
  } while( true );
}

Assistant:

int strbin (char *str)
{
	char *start = str;
	char *p = str, c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			*str++ = c;
		} else {
			switch (*p) {
				case 'a':
					*str++ = '\a';
					break;
				case 'b':
					*str++ = '\b';
					break;
				case 'c':
					*str++ = '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					*str++ = '\f';
					break;
				case 'n':
					*str++ = '\n';
					break;
				case 't':
					*str++ = '\t';
					break;
				case 'r':
					*str++ = '\r';
					break;
				case 'v':
					*str++ = '\v';
					break;
				case '?':
					*str++ = '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					*str++ = c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
							break;
						p++;
					}
					*str++ = c;
					break;
				default:
					*str++ = *p;
					break;
			}
			p++;
		}
	}
	*str = 0;
	return int(str - start);
}